

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

LoadConstantLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::LoadConstantLayerParams>
          (Arena *arena)

{
  LoadConstantLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (LoadConstantLayerParams *)operator_new(0x38);
    CoreML::Specification::LoadConstantLayerParams::LoadConstantLayerParams(this,(Arena *)0x0,false)
    ;
  }
  else {
    this = (LoadConstantLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x38,
                      (type_info *)&CoreML::Specification::LoadConstantLayerParams::typeinfo);
    CoreML::Specification::LoadConstantLayerParams::LoadConstantLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }